

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::compiler::Declaration::Builder::initAnnotation(Builder *__return_storage_ptr__,Builder *this)

{
  StructBuilder base;
  uint uVar1;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<1u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Declaration::Which>
            (&this->_builder,uVar1,ANNOTATION);
  uVar1 = bounded<96u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<97u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<98u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<99u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<100u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<101u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<102u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<103u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<104u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<105u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<106u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<107u>();
  capnp::_::StructBuilder::setDataField<bool>(&this->_builder,uVar1,false);
  uVar1 = bounded<5u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerBuilder::clear(&local_28);
  memcpy(&local_50,this,0x28);
  base.capTable = (CapTableBuilder *)uStack_48;
  base.segment = (SegmentBuilder *)local_50;
  base.data = (void *)local_40;
  base.pointers = (WirePointer *)uStack_38;
  base.dataSize = (undefined4)local_30;
  base.pointerCount = local_30._4_2_;
  base._38_2_ = local_30._6_2_;
  Annotation::Builder::Builder(__return_storage_ptr__,base);
  return __return_storage_ptr__;
}

Assistant:

inline typename Declaration::Annotation::Builder Declaration::Builder::initAnnotation() {
  _builder.setDataField<Declaration::Which>(
      ::capnp::bounded<1>() * ::capnp::ELEMENTS, Declaration::ANNOTATION);
  _builder.setDataField<bool>(::capnp::bounded<96>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<97>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<98>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<99>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<100>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<101>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<102>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<103>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<104>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<105>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<106>() * ::capnp::ELEMENTS, 0);
  _builder.setDataField<bool>(::capnp::bounded<107>() * ::capnp::ELEMENTS, 0);
  _builder.getPointerField(::capnp::bounded<5>() * ::capnp::POINTERS).clear();
  return typename Declaration::Annotation::Builder(_builder);
}